

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

void __thiscall UniValue::UniValue(UniValue *this,bool val_)

{
  byte in_SIL;
  UniValue *in_RDI;
  
  std::__cxx11::string::string((string *)&in_RDI->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x6c7fdd);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&in_RDI->values);
  setBool(in_RDI,(bool)(in_SIL & 1));
  return;
}

Assistant:

UniValue(bool val_) {
        setBool(val_);
    }